

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void __thiscall
xatlas::internal::BitImage::resize(BitImage *this,uint32_t w,uint32_t h,bool discard)

{
  unsigned_long *__dest;
  unsigned_long *__src;
  undefined3 in_register_00000009;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t index;
  uint32_t i;
  uint uVar4;
  Array<unsigned_long> tmp;
  ArrayBase local_58;
  ulong local_40;
  Array<unsigned_long> *local_38;
  
  uVar3 = w + 0x3f >> 6;
  if (CONCAT31(in_register_00000009,discard) == 0) {
    local_58.buffer = (uint8_t *)0x0;
    local_58.elementSize = 8;
    local_58.size = 0;
    local_58.capacity = 0;
    Array<unsigned_long>::resize((Array<unsigned_long> *)&local_58,uVar3 * h);
    local_40 = (ulong)w;
    memset(local_58.buffer,0,((ulong)local_58._8_8_ >> 0x20) << 3);
    if (uVar3 == this->m_rowStride) {
      uVar1 = this->m_height;
      if (h <= this->m_height) {
        uVar1 = h;
      }
      memcpy(local_58.buffer,(this->m_data).m_base.buffer,(ulong)(uVar1 * uVar3) << 3);
    }
    else if ((this->m_width != 0) && (uVar1 = this->m_height, uVar1 != 0)) {
      if (h <= uVar1) {
        uVar1 = h;
      }
      local_38 = &this->m_data;
      index = 0;
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        __dest = Array<unsigned_long>::operator[]((Array<unsigned_long> *)&local_58,index);
        __src = Array<unsigned_long>::operator[](local_38,this->m_rowStride * uVar4);
        uVar2 = this->m_rowStride;
        if (uVar3 < this->m_rowStride) {
          uVar2 = uVar3;
        }
        memcpy(__dest,__src,(ulong)(uVar2 << 3));
        index = index + uVar3;
      }
    }
    ArrayBase::moveTo(&local_58,&(this->m_data).m_base);
    w = (uint32_t)local_40;
    ArrayBase::~ArrayBase(&local_58);
  }
  else {
    Array<unsigned_long>::resize(&this->m_data,uVar3 * h);
    memset((this->m_data).m_base.buffer,0,
           (ulong)((this->m_data).m_base.size * (this->m_data).m_base.elementSize));
  }
  this->m_width = w;
  this->m_height = h;
  this->m_rowStride = uVar3;
  return;
}

Assistant:

void resize(uint32_t w, uint32_t h, bool discard)
	{
		const uint32_t rowStride = (w + 63) >> 6;
		if (discard) {
			m_data.resize(rowStride * h);
			m_data.zeroOutMemory();
		} else {
			Array<uint64_t> tmp;
			tmp.resize(rowStride * h);
			memset(tmp.data(), 0, tmp.size() * sizeof(uint64_t));
			// If only height has changed, can copy all rows at once.
			if (rowStride == m_rowStride) {
				memcpy(tmp.data(), m_data.data(), m_rowStride * min(m_height, h) * sizeof(uint64_t));
			} else if (m_width > 0 && m_height > 0) {
				const uint32_t height = min(m_height, h);
				for (uint32_t i = 0; i < height; i++)
					memcpy(&tmp[i * rowStride], &m_data[i * m_rowStride], min(rowStride, m_rowStride) * sizeof(uint64_t));
			}
			tmp.moveTo(m_data);
		}
		m_width = w;
		m_height = h;
		m_rowStride = rowStride;
	}